

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_loop_interp(jit_State *J,BCIns *pc,LoopEvent ev)

{
  int iVar1;
  LoopEvent ev_local;
  BCIns *pc_local;
  jit_State *J_local;
  
  if ((J->parent == 0) && (J->exitno == 0)) {
    if ((pc == J->startpc) && (J->framedepth + J->retdepth == 0)) {
      if (((J->cur).startins & 0xff) != 0x46) {
        if (ev == LOOPEV_LEAVE) {
          lj_trace_err(J,LJ_TRERR_LLEAVE);
        }
        lj_record_stop(J,LJ_TRLINK_LOOP,(uint)(J->cur).traceno);
      }
    }
    else if (ev != LOOPEV_LEAVE) {
      if ((*pc >> 0x10 != 0x7fff) && (iVar1 = innerloopleft(J,pc), iVar1 == 0)) {
        lj_trace_err(J,LJ_TRERR_LINNER);
      }
      if ((((ev != LOOPEV_ENTERLO) && (J->loopref != 0)) && (0x18 < (J->cur).nins - J->loopref)) ||
         (iVar1 = J->loopunroll + -1, J->loopunroll = iVar1, iVar1 < 0)) {
        lj_trace_err(J,LJ_TRERR_LUNROLL);
      }
      J->loopref = (J->cur).nins;
    }
  }
  else if (ev != LOOPEV_LEAVE) {
    J->loopref = (J->cur).nins;
    iVar1 = J->loopunroll + -1;
    J->loopunroll = iVar1;
    if (iVar1 < 0) {
      lj_trace_err(J,LJ_TRERR_LUNROLL);
    }
  }
  return;
}

Assistant:

static void rec_loop_interp(jit_State *J, const BCIns *pc, LoopEvent ev)
{
  if (J->parent == 0 && J->exitno == 0) {
    if (pc == J->startpc && J->framedepth + J->retdepth == 0) {
      if (bc_op(J->cur.startins) == BC_ITERN) return;  /* See rec_itern(). */
      /* Same loop? */
      if (ev == LOOPEV_LEAVE)  /* Must loop back to form a root trace. */
	lj_trace_err(J, LJ_TRERR_LLEAVE);
      lj_record_stop(J, LJ_TRLINK_LOOP, J->cur.traceno);  /* Looping trace. */
    } else if (ev != LOOPEV_LEAVE) {  /* Entering inner loop? */
      /* It's usually better to abort here and wait until the inner loop
      ** is traced. But if the inner loop repeatedly didn't loop back,
      ** this indicates a low trip count. In this case try unrolling
      ** an inner loop even in a root trace. But it's better to be a bit
      ** more conservative here and only do it for very short loops.
      */
      if (bc_j(*pc) != -1 && !innerloopleft(J, pc))
	lj_trace_err(J, LJ_TRERR_LINNER);  /* Root trace hit an inner loop. */
      if ((ev != LOOPEV_ENTERLO &&
	   J->loopref && J->cur.nins - J->loopref > 24) || --J->loopunroll < 0)
	lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
      J->loopref = J->cur.nins;
    }
  } else if (ev != LOOPEV_LEAVE) {  /* Side trace enters an inner loop. */
    J->loopref = J->cur.nins;
    if (--J->loopunroll < 0)
      lj_trace_err(J, LJ_TRERR_LUNROLL);  /* Limit loop unrolling. */
  }  /* Side trace continues across a loop that's left or not entered. */
}